

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

SimpleAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::nullopt_t_const&>
          (BumpAllocator *this,Expression *args,nullopt_t *args_1)

{
  SimpleAssertionExpr *pSVar1;
  
  pSVar1 = (SimpleAssertionExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((SimpleAssertionExpr *)this->endPtr < pSVar1 + 1) {
    pSVar1 = (SimpleAssertionExpr *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pSVar1 + 1);
  }
  (pSVar1->super_AssertionExpr).kind = Simple;
  (pSVar1->super_AssertionExpr).syntax = (SyntaxNode *)0x0;
  pSVar1->expr = args;
  (pSVar1->repetition).super__Optional_base<slang::ast::SequenceRepetition,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::SequenceRepetition>._M_engaged = false;
  pSVar1->isNullExpr = false;
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }